

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Try_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Try_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  pointer pBVar1;
  undefined1 auVar2 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Data *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  Boxed_Value BVar4;
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0059e870;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&Type_Info::Unknown_Type::typeinfo;
  *(pointer_____offset_0x10___ **)&p_Var3[1]._M_use_count = &Type_Info::Unknown_Type::typeinfo;
  *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0x20;
  *(undefined8 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[2]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[3]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[3]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[4]._vptr__Sp_counted_base + 2) = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node.identifier =
       p_Var3;
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node._vptr_AST_Node
       = (_func_int **)(p_Var3 + 1);
  chaiscript::detail::Dispatch_Engine::new_scope(*(Stack_Holder **)(in_RDX + 8));
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_58,
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  this_00 = p_Stack_50;
  auVar2 = local_58;
  local_58 = (undefined1  [8])0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node._vptr_AST_Node
       = (_func_int **)auVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node.identifier =
       this_00;
  Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  pBVar1 = t_ss[2].m_conversions.m_saves._M_data[-1].saves.
           super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (*(int *)&(pBVar1->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi == 0x1d) {
    AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_58,
               (Dispatch_State *)
               ((pBVar1[5].m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_type_info).m_type_info);
    p_Var3 = p_Stack_50;
    auVar2 = local_58;
    local_58 = (undefined1  [8])0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node.
    _vptr_AST_Node = (_func_int **)auVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node.identifier
         = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
    }
  }
  chaiscript::detail::Dispatch_Engine::pop_scope(*(Stack_Holder **)(in_RDX + 8));
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        Boxed_Value retval;

        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        try {
          retval = this->children[0]->eval(t_ss);
        } catch (const exception::eval_error &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (const std::runtime_error &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (const std::out_of_range &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (const std::exception &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (Boxed_Value &e) {
          retval = handle_exception(t_ss, e);
        } catch (...) {
          if (this->children.back()->identifier == AST_Node_Type::Finally) {
            this->children.back()->children[0]->eval(t_ss);
          }
          throw;
        }

        if (this->children.back()->identifier == AST_Node_Type::Finally) {
          retval = this->children.back()->children[0]->eval(t_ss);
        }

        return retval;
      }